

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

Rhs * __thiscall
Lib::
SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
::pop(Rhs *__return_storage_ptr__,
     SkipList<Inferences::ALASCA::Demodulation::Rhs,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::LDComparator>
     *this)

{
  uint uVar1;
  Node *node;
  uint64_t uVar2;
  uint64_t uVar3;
  Clause *pCVar4;
  undefined7 uVar5;
  Node *pNVar6;
  ulong uVar7;
  ulong uVar8;
  
  node = this->_left->nodes[0];
  uVar1 = this->_top;
  uVar7 = 1;
  if (1 < uVar1) {
    uVar7 = (ulong)uVar1;
  }
  pNVar6 = this->_left + 1;
  uVar8 = 1;
  do {
    if (uVar1 <= uVar8) {
LAB_002a8007:
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        this->_left->nodes[uVar8] = node->nodes[uVar8];
      }
      uVar2 = (node->value).term.super_TermList._content;
      uVar3 = (node->value).term._sort._content;
      uVar5 = *(undefined7 *)&(node->value).field_0x11;
      pCVar4 = (node->value).clause;
      __return_storage_ptr__->ordOptimization = (node->value).ordOptimization;
      *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar5;
      __return_storage_ptr__->clause = pCVar4;
      (__return_storage_ptr__->term).super_TermList._content = uVar2;
      (__return_storage_ptr__->term)._sort._content = uVar3;
      deallocate(node,(int)uVar7 - 1);
      return __return_storage_ptr__;
    }
    if ((Node *)(pNVar6->value).term.super_TermList._content != node) {
      uVar7 = uVar8 & 0xffffffff;
      goto LAB_002a8007;
    }
    uVar8 = uVar8 + 1;
    pNVar6 = (Node *)&(pNVar6->value).term._sort;
  } while( true );
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }